

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void fixupL(int n,int *perm_r,GlobalLU_t *Glu)

{
  int iVar1;
  int *piVar2;
  int_t *piVar3;
  int_t *piVar4;
  int_t *xlsub;
  int_t *lsub;
  int *xsup;
  int local_38;
  int_t jstrt;
  int_t j;
  int_t nextl;
  int k;
  int i;
  int fsupc;
  int nsuper;
  GlobalLU_t *Glu_local;
  int *perm_r_local;
  int n_local;
  
  if (1 < n) {
    piVar2 = Glu->xsup;
    piVar3 = Glu->lsub;
    piVar4 = Glu->xlsub;
    jstrt = 0;
    iVar1 = Glu->supno[n];
    for (nextl = 0; nextl <= iVar1; nextl = nextl + 1) {
      j = piVar2[nextl];
      local_38 = piVar4[j];
      piVar4[j] = jstrt;
      for (; local_38 < piVar4[j + 1]; local_38 = local_38 + 1) {
        piVar3[jstrt] = perm_r[piVar3[local_38]];
        jstrt = jstrt + 1;
      }
      while (j = j + 1, j < piVar2[nextl + 1]) {
        piVar4[j] = jstrt;
      }
    }
    piVar4[n] = jstrt;
  }
  return;
}

Assistant:

void
fixupL(const int n, const int *perm_r, GlobalLU_t *Glu)
{
    int nsuper, fsupc, i, k;
    int_t nextl, j, jstrt;
    int   *xsup;
    int_t *lsub, *xlsub;

    if ( n <= 1 ) return;

    xsup   = Glu->xsup;
    lsub   = Glu->lsub;
    xlsub  = Glu->xlsub;
    nextl  = 0;
    nsuper = (Glu->supno)[n];
    
    /* 
     * For each supernode ...
     */
    for (i = 0; i <= nsuper; i++) {
	fsupc = xsup[i];
	jstrt = xlsub[fsupc];
	xlsub[fsupc] = nextl;
	for (j = jstrt; j < xlsub[fsupc+1]; j++) {
	    lsub[nextl] = perm_r[lsub[j]]; /* Now indexed into P*A */
	    nextl++;
  	}
	for (k = fsupc+1; k < xsup[i+1]; k++) 
	    	xlsub[k] = nextl;	/* Other columns in supernode i */

    }

    xlsub[n] = nextl;
}